

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwtran.c
# Opt level: O0

void png_do_write_transformations(png_structrp png_ptr,png_row_infop row_info)

{
  png_row_infop row_info_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    if (((png_ptr->transformations & 0x100000) != 0) &&
       (png_ptr->write_user_transform_fn != (png_user_transform_ptr)0x0)) {
      (*png_ptr->write_user_transform_fn)(png_ptr,row_info,png_ptr->row_buf + 1);
    }
    if ((png_ptr->transformations & 0x8000) != 0) {
      png_do_strip_channel
                (row_info,png_ptr->row_buf + 1,(uint)(((png_ptr->flags & 0x80) != 0 ^ 0xffU) & 1));
    }
    if ((png_ptr->transformations & 0x10000) != 0) {
      png_do_packswap(row_info,png_ptr->row_buf + 1);
    }
    if ((png_ptr->transformations & 4) != 0) {
      png_do_pack(row_info,png_ptr->row_buf + 1,(uint)png_ptr->bit_depth);
    }
    if ((png_ptr->transformations & 0x10) != 0) {
      png_do_swap(row_info,png_ptr->row_buf + 1);
    }
    if ((png_ptr->transformations & 8) != 0) {
      png_do_shift(row_info,png_ptr->row_buf + 1,&png_ptr->shift);
    }
    if ((png_ptr->transformations & 0x20000) != 0) {
      png_do_write_swap_alpha(row_info,png_ptr->row_buf + 1);
    }
    if ((png_ptr->transformations & 0x80000) != 0) {
      png_do_write_invert_alpha(row_info,png_ptr->row_buf + 1);
    }
    if ((png_ptr->transformations & 1) != 0) {
      png_do_bgr(row_info,png_ptr->row_buf + 1);
    }
    if ((png_ptr->transformations & 0x20) != 0) {
      png_do_invert(row_info,png_ptr->row_buf + 1);
    }
  }
  return;
}

Assistant:

void /* PRIVATE */
png_do_write_transformations(png_structrp png_ptr, png_row_infop row_info)
{
   png_debug(1, "in png_do_write_transformations");

   if (png_ptr == NULL)
      return;

#ifdef PNG_WRITE_USER_TRANSFORM_SUPPORTED
   if ((png_ptr->transformations & PNG_USER_TRANSFORM) != 0)
      if (png_ptr->write_user_transform_fn != NULL)
         (*(png_ptr->write_user_transform_fn)) /* User write transform
                                                 function */
             (png_ptr,  /* png_ptr */
             row_info,  /* row_info: */
                /*  png_uint_32 width;       width of row */
                /*  size_t rowbytes;         number of bytes in row */
                /*  png_byte color_type;     color type of pixels */
                /*  png_byte bit_depth;      bit depth of samples */
                /*  png_byte channels;       number of channels (1-4) */
                /*  png_byte pixel_depth;    bits per pixel (depth*channels) */
             png_ptr->row_buf + 1);      /* start of pixel data for row */
#endif

#ifdef PNG_WRITE_FILLER_SUPPORTED
   if ((png_ptr->transformations & PNG_FILLER) != 0)
      png_do_strip_channel(row_info, png_ptr->row_buf + 1,
          !(png_ptr->flags & PNG_FLAG_FILLER_AFTER));
#endif

#ifdef PNG_WRITE_PACKSWAP_SUPPORTED
   if ((png_ptr->transformations & PNG_PACKSWAP) != 0)
      png_do_packswap(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_PACK_SUPPORTED
   if ((png_ptr->transformations & PNG_PACK) != 0)
      png_do_pack(row_info, png_ptr->row_buf + 1,
          (png_uint_32)png_ptr->bit_depth);
#endif

#ifdef PNG_WRITE_SWAP_SUPPORTED
#  ifdef PNG_16BIT_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_BYTES) != 0)
      png_do_swap(row_info, png_ptr->row_buf + 1);
#  endif
#endif

#ifdef PNG_WRITE_SHIFT_SUPPORTED
   if ((png_ptr->transformations & PNG_SHIFT) != 0)
      png_do_shift(row_info, png_ptr->row_buf + 1,
           &(png_ptr->shift));
#endif

#ifdef PNG_WRITE_SWAP_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_SWAP_ALPHA) != 0)
      png_do_write_swap_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_INVERT_ALPHA_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_ALPHA) != 0)
      png_do_write_invert_alpha(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_BGR_SUPPORTED
   if ((png_ptr->transformations & PNG_BGR) != 0)
      png_do_bgr(row_info, png_ptr->row_buf + 1);
#endif

#ifdef PNG_WRITE_INVERT_SUPPORTED
   if ((png_ptr->transformations & PNG_INVERT_MONO) != 0)
      png_do_invert(row_info, png_ptr->row_buf + 1);
#endif
}